

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O3

AggregateFunctionSet * duckdb::BitstringAggFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  LogicalType *type;
  LogicalType *type_00;
  LogicalType *local_50;
  LogicalType *local_48;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"bitstring_agg","");
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  LogicalType::Integral();
  for (type_00 = local_50; type_00 != local_48; type_00 = type_00 + 1) {
    GetBitStringAggregate(type_00,in_RDI);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_50);
  return in_RDI;
}

Assistant:

AggregateFunctionSet BitstringAggFun::GetFunctions() {
	AggregateFunctionSet bitstring_agg("bitstring_agg");
	for (auto &type : LogicalType::Integral()) {
		GetBitStringAggregate(type, bitstring_agg);
	}
	return bitstring_agg;
}